

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::ExpressionStatement::tokenize(ExpressionStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_28;
  Token local_18;
  
  (*this->m_expression->_vptr_Expression[3])();
  local_18.m_type = SEMICOLON;
  this_00 = TokenStream::operator<<(str,&local_18);
  local_28.m_type = NEWLINE;
  TokenStream::operator<<(this_00,&local_28);
  Token::~Token(&local_28);
  Token::~Token(&local_18);
  return;
}

Assistant:

void ExpressionStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_expression);
	m_expression->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}